

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O0

void __thiscall merlin::wmb::tighten(wmb *this,size_t nIter,double stopTime,double stopObj)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  void *this_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dObj;
  double prevZ;
  double step;
  size_t iter;
  double minZ;
  double stopObj_local;
  double stopTime_local;
  size_t nIter_local;
  wmb *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"[WMB] Begin message passing over join graph ...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iter = (size_t)infty();
  for (step = 4.94065645841247e-324; (ulong)step <= nIter; step = (double)((long)step + 1)) {
    auVar6._8_4_ = (int)((ulong)step >> 0x20);
    auVar6._0_8_ = step;
    auVar6._12_4_ = 0x45300000;
    dVar4 = this->m_logz;
    forward(this,1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,SUB84(step,0)) - 4503599627370496.0)));
    backward(this,(size_t)step);
    update(this);
    if (this->m_logz < (double)iter) {
      iter = (size_t)this->m_logz;
    }
    dVar4 = ABS(this->m_logz - dVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"  logZ: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
    _Var1 = std::setw(0xc);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(6);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_logz);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::scientific);
    _Var2 = std::setprecision(6);
    poVar3 = std::operator<<(poVar3,_Var2);
    dVar5 = exp(this->m_logz);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
    std::operator<<(poVar3,") ");
    poVar3 = std::operator<<((ostream *)&std::cout,"\td=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
    poVar3 = std::operator<<(poVar3,"\t time=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
    _Var2 = std::setprecision(6);
    poVar3 = std::operator<<(poVar3,_Var2);
    dVar5 = timeSystem();
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,dVar5 - (this->super_algorithm).m_start_time);
    poVar3 = std::operator<<(poVar3,"\ti=");
    this_00 = (void *)std::ostream::operator<<(poVar3,(ulong)step);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if ((dVar4 < stopObj) ||
       ((0.0 < stopTime &&
        (dVar4 = timeSystem(), stopTime <= dVar4 - (this->super_algorithm).m_start_time)))) break;
  }
  this->m_logz = (double)iter;
  return;
}

Assistant:

void wmb::tighten(size_t nIter, double stopTime, double stopObj) {
	std::cout << "[WMB] Begin message passing over join graph ..." << std::endl;

	double minZ = infty();
	for (size_t iter = 1; iter <= nIter; ++iter) {
		double step = 1.0/(double)iter;
		double prevZ = m_logz;

		forward(step);
		backward(iter);
		update();

		// keep track of tightest upper bound
		if (m_logz < minZ) {
			minZ = m_logz;
		}

		double dObj = fabs(m_logz - prevZ);
		std::cout << "  logZ: " << std::fixed
				<< std::setw(12) << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
		std::cout << "\td=" << dObj << "\t time="  << std::fixed
			<< std::setprecision(MERLIN_PRECISION) << (timeSystem() - m_start_time)
			<< "\ti=" << iter << std::endl;

		if (dObj < stopObj) {
			break;
		}

		// do at least one iterations
		if (stopTime > 0 && stopTime <= (timeSystem() - m_start_time)) {
			break;
		}
	} // end for

	m_logz = minZ; // keep tightest upper bound
}